

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# velocypack-common.h
# Opt level: O0

unsigned_long arangodb::velocypack::readIntegerFixed<unsigned_long,4ul>(uint8_t *start)

{
  unsigned_long uVar1;
  
  uVar1 = readIntFixedHelper<unsigned_long,4u,0u>((uint8_t *)0x134a0e);
  return uVar1;
}

Assistant:

static inline T readIntegerFixed(uint8_t const* start) noexcept {
  static_assert(std::is_unsigned<T>::value, "result type must be unsigned");
  static_assert(length > 0, "length must be > 0");
  static_assert(length <= sizeof(T), "length must be <= sizeof(T)");
  static_assert(length <= 8);
  if constexpr (1 == length) {
    return *start;
  }
  if constexpr (length > 1 &&
                length < 5) {  // starting with 5 bytes memcpy shows better
                               // results than shifts. But
    return readIntFixedHelper<T, length>(
        start);  // for big-endian we leave shifts as this saves some cpu cyles
                 // on byteswapping
  }
  if constexpr (length >= 5 && length < 8) {
    if constexpr (std::endian::native != std::endian::little) {
      return readIntFixedHelper<T, length>(start);
    } else {
      T v{};
      memcpy(&v, start, length);
      return v;
    }
  }
  if constexpr (length == 8) {
    T v;
    memcpy(&v, start, 8);
    if constexpr (std::endian::native != std::endian::little) {
      v = littleToHost(v);
    }
    return v;
  }
  return 0;
}